

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nukedopl3.c
# Opt level: O3

void * nukedopl3_init(UINT32 clock,UINT32 rate)

{
  void *pvVar1;
  
  pvVar1 = calloc(1,0x5210);
  if (pvVar1 != (void *)0x0) {
    *(UINT32 *)((long)pvVar1 + 8) = clock;
    *(UINT32 *)((long)pvVar1 + 0xc) = rate;
  }
  return pvVar1;
}

Assistant:

void* nukedopl3_init(UINT32 clock, UINT32 rate)
{
	opl3_chip *opl3;

	opl3 = (opl3_chip*)calloc(1, sizeof(opl3_chip));
	if (opl3 == NULL)
		return NULL;
	
	opl3->clock = clock;
	opl3->smplRate = rate; // save for reset
	
	return opl3;
}